

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void ThreadHTTP(event_base *base)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"http",&local_39);
  util::ThreadRename(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = LogAcceptCategory(HTTP,Debug);
  if (bVar1) {
    logging_function._M_str = "ThreadHTTP";
    logging_function._M_len = 10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<>(logging_function,source_file,0x15f,HTTP,Debug,"Entering http event loop\n");
  }
  event_base_dispatch(base);
  bVar1 = LogAcceptCategory(HTTP,Debug);
  if (bVar1) {
    logging_function_00._M_str = "ThreadHTTP";
    logging_function_00._M_len = 10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file_00._M_len = 0x57;
    LogPrintf_<>(logging_function_00,source_file_00,0x162,HTTP,Debug,"Exited http event loop\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ThreadHTTP(struct event_base* base)
{
    util::ThreadRename("http");
    LogDebug(BCLog::HTTP, "Entering http event loop\n");
    event_base_dispatch(base);
    // Event loop will be interrupted by InterruptHTTPServer()
    LogDebug(BCLog::HTTP, "Exited http event loop\n");
}